

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::EnumNameMethod::EnumNameMethod(EnumNameMethod *this,Builtins *builtins)

{
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_28;
  
  local_28.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Name,Function,0,&local_28,
             &(builtins->stringType).super_Type,true,false);
  if (local_28.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005d58d0;
  return;
}

Assistant:

explicit EnumNameMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Name, SubroutineKind::Function, 0, {},
                               builtins.stringType, true) {}